

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<char,_40UL>::SmallVector(SmallVector<char,_40UL> *this,Base *other)

{
  bool bVar1;
  move_iterator<char_*> last;
  move_iterator<char_*> this_00;
  char *pcVar2;
  unsigned_long uVar3;
  move_iterator<char_*> in_RSI;
  SmallVectorBase<char> *in_RDI;
  void **in_stack_ffffffffffffff98;
  SmallVectorBase<char> *in_stack_ffffffffffffffa0;
  
  SmallVectorBase<char>::SmallVectorBase(in_RDI);
  bVar1 = SmallVectorBase<char>::isSmall((SmallVectorBase<char> *)in_RSI._M_current);
  if (bVar1) {
    in_RDI->cap = 0x28;
    SmallVectorBase<char>::begin((SmallVectorBase<char> *)in_RSI._M_current);
    last = std::make_move_iterator<char*>((char *)in_stack_ffffffffffffff98);
    SmallVectorBase<char>::end((SmallVectorBase<char> *)in_RSI._M_current);
    this_00 = std::make_move_iterator<char*>((char *)in_stack_ffffffffffffff98);
    SmallVectorBase<char>::append<std::move_iterator<char_*>_>
              ((SmallVectorBase<char> *)this_00._M_current,in_RSI,last);
    SmallVectorBase<char>::clear(in_stack_ffffffffffffffa0);
  }
  else {
    pcVar2 = std::exchange<char*,decltype(nullptr)>
                       (&in_stack_ffffffffffffffa0->data_,in_stack_ffffffffffffff98);
    in_RDI->data_ = pcVar2;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->len = uVar3;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->cap = uVar3;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }